

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O0

TypeSpecifiers * __thiscall CParse::addTypeSpecifier(CParse *this,TypeSpecifiers *spec,Datatype *tp)

{
  allocator local_41;
  string local_40 [32];
  Datatype *local_20;
  Datatype *tp_local;
  TypeSpecifiers *spec_local;
  CParse *this_local;
  
  local_20 = tp;
  tp_local = (Datatype *)spec;
  if (spec->type_specifier != (Datatype *)0x0) {
    spec_local = (TypeSpecifiers *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Multiple type specifiers",&local_41);
    setError(this,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  tp_local->_vptr_Datatype = (_func_int **)local_20;
  return (TypeSpecifiers *)tp_local;
}

Assistant:

TypeSpecifiers *CParse::addTypeSpecifier(TypeSpecifiers *spec,Datatype *tp)

{
  if (spec->type_specifier!=(Datatype *)0)
    setError("Multiple type specifiers");
  spec->type_specifier = tp;
  return spec;
}